

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O1

int float16_is_signaling_nan_mips64el(float16 a_,float_status *status)

{
  uint16_t a;
  bool bVar1;
  
  if (status->snan_bit_is_one == '\0') {
    bVar1 = (a_ & 0x1ff) != 0 && (a_ & 0x7e00) == 0x7c00;
  }
  else {
    bVar1 = 0x7c7f < (a_ & 0x7f80);
  }
  return (int)bVar1;
}

Assistant:

int float16_is_signaling_nan(float16 a_, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return 0;
#else
    uint16_t a = float16_val(a_);
    if (snan_bit_is_one(status)) {
        return ((a & ~0x8000) >= 0x7C80);
    } else {
        return (((a >> 9) & 0x3F) == 0x3E) && (a & 0x1FF);
    }
#endif
}